

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::ParseAddtlInfo_SnapGeneratorFunctionInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  int iVar1;
  SnapGeneratorFunctionInfo *addtlInfo;
  TTD_PTR_ID TVar2;
  
  addtlInfo = (SnapGeneratorFunctionInfo *)
              SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  TVar2 = FileReader::ReadAddr(reader,objectId,true);
  addtlInfo->scriptFunction = TVar2;
  iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  addtlInfo->isAnonymousFunction = SUB41(iVar1,0);
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapGeneratorFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)34>
            (snpObject,addtlInfo);
  return;
}

Assistant:

void ParseAddtlInfo_SnapGeneratorFunctionInfo(SnapObject *snpObject, FileReader *reader, SlabAllocator &alloc)
        {
            SnapGeneratorFunctionInfo* sgfi = alloc.SlabAllocateStruct<SnapGeneratorFunctionInfo>();
            sgfi->scriptFunction = reader->ReadAddr(NSTokens::Key::objectId, true);
            sgfi->isAnonymousFunction = reader->ReadBool(NSTokens::Key::boolVal, true);
            SnapObjectSetAddtlInfoAs<SnapGeneratorFunctionInfo*, SnapObjectType::SnapGeneratorFunction>(snpObject, sgfi);
        }